

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall AGSSock::AGSSocket::Unserialize(AGSSocket *this)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  int in_ECX;
  void *in_RDX;
  undefined4 in_ESI;
  ulong uVar3;
  size_t __n;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined1 *puStack_70;
  long lStack_68;
  undefined1 uStack_60;
  undefined7 uStack_5f;
  long *aplStack_50 [2];
  long alStack_40 [2];
  
  uVar3 = (ulong)in_ECX;
  __n = 0x18;
  if (uVar3 < 0x18) {
    __n = uVar3;
  }
  memcpy(&uStack_88,in_RDX,__n);
  lStack_68 = 0;
  uStack_60 = 0;
  puStack_70 = &uStack_60;
  if ((int)__n < in_ECX) {
    aplStack_50[0] = alStack_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)aplStack_50,__n + (long)in_RDX,uVar3 + (long)in_RDX);
    std::__cxx11::string::operator=((string *)&puStack_70,(string *)aplStack_50);
    if (aplStack_50[0] != alStack_40) {
      operator_delete(aplStack_50[0],alStack_40[0] + 1);
    }
  }
  puVar1 = (undefined4 *)operator_new(0xa0);
  *puVar1 = 0xffffffff;
  puVar1[1] = uStack_88;
  puVar1[2] = uStack_84;
  puVar1[3] = uStack_80;
  puVar1[4] = uStack_7c;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,uStack_78);
  *(undefined8 *)(puVar1 + 6) = uVar2;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,uStack_74);
  *(undefined8 *)(puVar1 + 8) = uVar2;
  *(undefined4 **)(puVar1 + 10) = puVar1 + 0xe;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar1 + 10),puStack_70,puStack_70 + lStack_68);
  *(undefined8 *)(puVar1 + 0x22) = 0;
  *(undefined8 *)(puVar1 + 0x24) = 0;
  *(undefined8 *)(puVar1 + 0x1e) = 0;
  *(undefined8 *)(puVar1 + 0x20) = 0;
  *(undefined8 *)(puVar1 + 0x1a) = 0;
  *(undefined8 *)(puVar1 + 0x1c) = 0;
  *(undefined8 *)(puVar1 + 0x16) = 0;
  *(undefined8 *)(puVar1 + 0x18) = 0;
  *(undefined8 *)(puVar1 + 0x12) = 0;
  *(undefined8 *)(puVar1 + 0x14) = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(puVar1 + 0x12),0);
  puVar1[0x26] = 0;
  (**(code **)(*AGSSockAPI::engine + 0x230))(AGSSockAPI::engine,in_ESI,puVar1,&agsSocket);
  if (puStack_70 != &uStack_60) {
    operator_delete(puStack_70,CONCAT71(uStack_5f,uStack_60) + 1);
  }
  return;
}

Assistant:

void AGSSocket::Unserialize(int key, const char *buffer, int length)
{
	AGSSocketSerial serial;
	int size = MIN(length, sizeof (AGSSocketSerial));
	memcpy(&serial, buffer, size);

	string tag;
	if (length - size > 0)
		tag = string(buffer + size, (size_t) length - size);
	
	Socket *sock = new Socket
	{
		INVALID_SOCKET,
		serial.domain, serial.type, serial.protocol,
		serial.error,
		AGS_FROM_KEY(SockAddr, serial.local),
		AGS_FROM_KEY(SockAddr, serial.remote),
		tag
	};
	
	AGS_RESTORE(Socket, sock, key);
}